

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O1

void sensors_analytics::utils::ObjectNode::ValueNode::DumpString(string *value,string *buffer)

{
  char cVar1;
  ulong uVar2;
  char cVar3;
  
  cVar3 = (char)buffer;
  std::__cxx11::string::push_back(cVar3);
  if (value->_M_string_length != 0) {
    uVar2 = 0;
    do {
      cVar1 = (value->_M_dataplus)._M_p[uVar2];
      switch(cVar1) {
      case '\b':
        break;
      case '\t':
        break;
      case '\n':
        break;
      case '\v':
switchD_00110240_caseD_b:
        std::__cxx11::string::push_back(cVar3);
        goto LAB_001102a8;
      case '\f':
        break;
      case '\r':
        break;
      default:
        if ((cVar1 != '\\') && (cVar1 != '\"')) goto switchD_00110240_caseD_b;
      }
      std::__cxx11::string::append((char *)buffer);
LAB_001102a8:
      uVar2 = uVar2 + 1;
    } while (uVar2 < value->_M_string_length);
  }
  std::__cxx11::string::push_back(cVar3);
  return;
}

Assistant:

void ObjectNode::ValueNode::DumpString(const string &value, string *buffer) {
  *buffer += '"';
  for (std::string::size_type i = 0; i < value.length(); ++i) {
    char c = value[i];
    switch (c) {
      case '"':
        *buffer += "\\\"";
        break;
      case '\\':
        *buffer += "\\\\";
        break;
      case '\b':
        *buffer += "\\b";
        break;
      case '\f':
        *buffer += "\\f";
        break;
      case '\n':
        *buffer += "\\n";
        break;
      case '\r':
        *buffer += "\\r";
        break;
      case '\t':
        *buffer += "\\t";
        break;
      default:
        *buffer += c;
        break;
    }
  }
  *buffer += '"';
}